

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.hpp
# Opt level: O0

shared_ptr<libtorrent::dht::obfuscated_get_peers_observer> __thiscall
libtorrent::dht::rpc_manager::
allocate_observer<libtorrent::dht::obfuscated_get_peers_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
          (rpc_manager *this,shared_ptr<libtorrent::dht::traversal_algorithm> *args,
          basic_endpoint<boost::asio::ip::udp> *args_1,digest32<160L> *args_2)

{
  rpc_manager *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  node_id *in_R8;
  shared_ptr<libtorrent::dht::obfuscated_get_peers_observer> sVar2;
  shared_ptr<libtorrent::dht::traversal_algorithm> local_50;
  anon_class_8_1_8991fb9c_for__M_tp local_40;
  anon_class_8_1_8991fb9c_for__M_tp deleter;
  void *ptr;
  digest32<160L> *args_local_2;
  basic_endpoint<boost::asio::ip::udp> *args_local_1;
  shared_ptr<libtorrent::dht::traversal_algorithm> *args_local;
  rpc_manager *this_local;
  
  this_00 = (rpc_manager *)allocate_observer((rpc_manager *)args);
  deleter.this = this_00;
  if (this_00 == (rpc_manager *)0x0) {
    ::std::shared_ptr<libtorrent::dht::obfuscated_get_peers_observer>::shared_ptr
              ((shared_ptr<libtorrent::dht::obfuscated_get_peers_observer> *)this);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    local_40.this = (rpc_manager *)args;
    ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::shared_ptr
              (&local_50,(shared_ptr<libtorrent::dht::traversal_algorithm> *)args_1);
    obfuscated_get_peers_observer::obfuscated_get_peers_observer
              ((obfuscated_get_peers_observer *)this_00,&local_50,(endpoint *)args_2,in_R8);
    ::std::shared_ptr<libtorrent::dht::obfuscated_get_peers_observer>::
    shared_ptr<libtorrent::dht::obfuscated_get_peers_observer,libtorrent::dht::rpc_manager::allocate_observer<libtorrent::dht::obfuscated_get_peers_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>(std::shared_ptr<libtorrent::dht::traversal_algorithm>&&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&)::_lambda(libtorrent::dht::observer*)_1_,void>
              ((shared_ptr<libtorrent::dht::obfuscated_get_peers_observer> *)this,
               (obfuscated_get_peers_observer *)this_00,local_40);
    ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::~shared_ptr(&local_50);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.
  super___shared_ptr<libtorrent::dht::obfuscated_get_peers_observer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.
  super___shared_ptr<libtorrent::dht::obfuscated_get_peers_observer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<libtorrent::dht::obfuscated_get_peers_observer>)
         sVar2.
         super___shared_ptr<libtorrent::dht::obfuscated_get_peers_observer,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<T> allocate_observer(Args&&... args)
	{
		void* ptr = allocate_observer();
		if (ptr == nullptr) return std::shared_ptr<T>();

		auto deleter = [this](observer* o)
		{
			TORRENT_ASSERT(o->m_in_use);
			o->~observer();
			free_observer(o);
		};
		return std::shared_ptr<T>(new (ptr) T(std::forward<Args>(args)...), deleter);
	}